

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::DropTypes(TypeChecker *this,size_t drop_count)

{
  size_t sVar1;
  LabelType *pLVar2;
  bool bVar3;
  size_type sVar4;
  __normal_iterator<wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_> local_58;
  const_iterator local_50;
  __normal_iterator<wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_> local_48;
  __normal_iterator<wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_> local_40;
  const_iterator local_38;
  Enum local_2c;
  Label *local_28;
  Label *label;
  size_t drop_count_local;
  TypeChecker *this_local;
  
  label = (Label *)drop_count;
  drop_count_local = (size_t)this;
  local_2c = (Enum)TopLabel(this,&local_28);
  bVar3 = Failed((Result)local_2c);
  if (bVar3) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    sVar1 = local_28->type_stack_limit;
    pLVar2 = &label->label_type;
    sVar4 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(&this->type_stack_);
    if (sVar4 < (long)pLVar2 + sVar1) {
      ResetTypeStackToLabel(this,local_28);
      Result::Result((Result *)((long)&this_local + 4),(uint)((local_28->unreachable & 1U) == 0));
    }
    else {
      local_48._M_current =
           (Type *)std::vector<wabt::Type,_std::allocator<wabt::Type>_>::end(&this->type_stack_);
      local_40 = __gnu_cxx::
                 __normal_iterator<wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>
                 ::operator-(&local_48,(difference_type)label);
      __gnu_cxx::
      __normal_iterator<wabt::Type_const*,std::vector<wabt::Type,std::allocator<wabt::Type>>>::
      __normal_iterator<wabt::Type*>
                ((__normal_iterator<wabt::Type_const*,std::vector<wabt::Type,std::allocator<wabt::Type>>>
                  *)&local_38,&local_40);
      local_58._M_current =
           (Type *)std::vector<wabt::Type,_std::allocator<wabt::Type>_>::end(&this->type_stack_);
      __gnu_cxx::
      __normal_iterator<wabt::Type_const*,std::vector<wabt::Type,std::allocator<wabt::Type>>>::
      __normal_iterator<wabt::Type*>
                ((__normal_iterator<wabt::Type_const*,std::vector<wabt::Type,std::allocator<wabt::Type>>>
                  *)&local_50,&local_58);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::erase
                (&this->type_stack_,local_38,local_50);
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::DropTypes(size_t drop_count) {
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  if (label->type_stack_limit + drop_count > type_stack_.size()) {
    ResetTypeStackToLabel(label);
    return label->unreachable ? Result::Ok : Result::Error;
  }
  type_stack_.erase(type_stack_.end() - drop_count, type_stack_.end());
  return Result::Ok;
}